

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.h
# Opt level: O2

void __thiscall TadsThreadList::clean(TadsThreadList *this)

{
  TadsThreadLink **ppTVar1;
  TadsThreadLink *pTVar2;
  TadsThreadLink *this_00;
  bool bVar3;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->mu->h);
  pTVar2 = this->head;
  this_00 = (TadsThreadLink *)0x0;
  do {
    bVar3 = this_00 == (TadsThreadLink *)0x0;
    ppTVar1 = &this_00->nxt;
    this_00 = pTVar2;
    if (bVar3) {
      ppTVar1 = &this->head;
    }
    while( true ) {
      if (this_00 == (TadsThreadLink *)0x0) {
        pthread_mutex_unlock((pthread_mutex_t *)&this->mu->h);
        return;
      }
      pTVar2 = this_00->nxt;
      if (this_00->thread->ref_ != (CVmWeakRefable *)0x0) break;
      *ppTVar1 = pTVar2;
      TadsThreadLink::~TadsThreadLink(this_00);
      operator_delete(this_00,0x10);
      this_00 = pTVar2;
    }
  } while( true );
}

Assistant:

void clean()
    {
        /* lock the list */
        mu->lock();

        /* 
         *   Unlink the thread from the list.  It's possible that it's not in
         *   the list any longer, since wait_all() removes threads before
         *   waiting for them to exit.  
         */
        TadsThreadLink *cur, *prv, *nxt;
        for (prv = 0, cur = head ; cur != 0 ; cur = nxt)
        {
            /* remember the next thread */
            nxt = cur->nxt;
            
            /* check to see if this thread is still alive */
            if (cur->thread->test())
            {
                /* it's still alive - keep it in the list */
                prv = cur;
            }
            else
            {
                /* this thread is gone - remove the link */
                if (prv != 0)
                    prv->nxt = nxt;
                else
                    head = nxt;

                /* delete the link */
                delete cur;
            }
        }

        /* done with the list lock */
        mu->unlock();
    }